

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O1

void __thiscall Node::OutputPrototypes(Node *this,ostream *os)

{
  int iVar1;
  char cVar2;
  ostream *poVar3;
  string local_50;
  
  cVar2 = (char)os;
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar2);
  std::ostream::put(cVar2);
  poVar3 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"//",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  poVar3 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"// Function Prototypes",0x16);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  poVar3 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"//",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  do {
    iVar1 = this->Type;
    if (iVar1 < 0x14e) {
      if (iVar1 == 0x143) goto LAB_0010bc64;
      if ((iVar1 == 0x144) && (this->Block[2] != (Node *)0x0)) {
        OutputPrototypes(this->Block[2],os);
      }
    }
    else if (((iVar1 == 0x14e) || (iVar1 == 0x1a1)) || (iVar1 == 0x17c)) {
LAB_0010bc64:
      VariableList::NewLevel(Variables);
      if (this->Block[2] != (Node *)0x0) {
        OutputPrototypes(this->Block[2],os);
      }
      VariableScanOne(this,1);
      VariableList::Fixup(Variables);
      OutputNewDefinition_abi_cxx11_(&local_50,this);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,local_50._M_dataplus._M_p,local_50._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,";",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      VariableList::KillLevel(Variables);
    }
    this = this->Block[0];
    if (this == (Node *)0x0) {
      std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
      return;
    }
  } while( true );
}

Assistant:

void Node::OutputPrototypes(
	std::ostream& os	/**< iostream to write the C++ code to */
)
{
	Node* ThisNode = this;

	//
	// Output title for prototype section
	//
	os << std::endl <<
		"//" << std::endl <<
		"// Function Prototypes" << std::endl <<
		"//" << std::endl;

	//
	// Go through the level 0 functions
	//
	while(ThisNode != 0)
	{

		switch(ThisNode->Type)
		{
		case BAS_S_PROGRAM:
		case BAS_S_FUNCTION:
		case BAS_S_SUB:
		case BAS_S_HANDLER:

			//
			// Empty variable list
			//
			Variables->NewLevel();

			//
			// Handle any DEF*'s that are in there
			//
			if (ThisNode->Block[2] != 0)
			{
				ThisNode->Block[2]->OutputPrototypes(os);
			}

			//
			// Scan the call parameters
			//
			ThisNode->VariableScanOne(1);
			Variables->Fixup();

			//
			// Output function name
			//
			os << ThisNode->OutputNewDefinition() << ";" << std::endl;

			Variables->KillLevel();

			break;

		case BAS_S_MAINFUNCTION:
			//
			// Handle any DEF*'s that are in there
			//
			if (ThisNode->Block[2] != 0)
			{
				ThisNode->Block[2]->OutputPrototypes(os);
			}
			break;

		}

		ThisNode = ThisNode->Block[0];
	}

	os << std::endl;
}